

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::noteNetAlias
          (Compilation *this,Scope *scope,Symbol *firstSym,DriverBitRange firstRange,
          Expression *firstExpr,Symbol *secondSym,DriverBitRange secondRange,Expression *secondExpr)

{
  group_type_pointer pgVar1;
  Path *this_00;
  Path *this_01;
  undefined4 uVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  Compilation *pCVar7;
  bool bVar8;
  Diagnostic *pDVar9;
  ulong pos0;
  value_type_pointer ppVar10;
  SourceLocation SVar11;
  ulong uVar12;
  ulong hash;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  NetAlias *newAlias;
  iterator end;
  Expression *local_120;
  Symbol *local_118;
  Expression *local_110;
  Symbol *local_108;
  Scope *local_100;
  pair<unsigned_long,_unsigned_long> local_f8;
  Compilation *local_e8;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *local_e0;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  overlap_iterator local_c0;
  iterator local_70;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *this_02;
  
  local_108 = secondSym;
  local_120 = secondExpr;
  local_118 = firstSym;
  local_110 = firstExpr;
  local_f8.first = firstRange.first;
  local_f8.second = firstRange.second;
  if (secondSym < firstSym) {
    local_118 = secondSym;
    local_f8.first = secondRange.first;
    local_f8.second = secondRange.second;
    local_110 = secondExpr;
    secondRange.first = firstRange.first;
    secondRange.second = firstRange.second;
    local_120 = firstExpr;
    local_108 = firstSym;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_118;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->netAliases).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar10 = (this->netAliases).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
            .arrays.elements_;
  uVar3 = (this->netAliases).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
          .arrays.groups_size_mask;
  uVar12 = 0;
  uVar15 = pos0;
  do {
    pgVar1 = (this->netAliases).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
             .arrays.groups_ + uVar15;
    local_d8 = pgVar1->m[0].n;
    uStack_d7 = pgVar1->m[1].n;
    uStack_d6 = pgVar1->m[2].n;
    bStack_d5 = pgVar1->m[3].n;
    uStack_d4 = pgVar1->m[4].n;
    uStack_d3 = pgVar1->m[5].n;
    uStack_d2 = pgVar1->m[6].n;
    bStack_d1 = pgVar1->m[7].n;
    uStack_d0 = pgVar1->m[8].n;
    uStack_cf = pgVar1->m[9].n;
    uStack_ce = pgVar1->m[10].n;
    bStack_cd = pgVar1->m[0xb].n;
    uStack_cc = pgVar1->m[0xc].n;
    uStack_cb = pgVar1->m[0xd].n;
    uStack_ca = pgVar1->m[0xe].n;
    bStack_c9 = pgVar1->m[0xf].n;
    uVar16 = (uchar)uVar2;
    auVar20[0] = -(local_d8 == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 8);
    auVar20[1] = -(uStack_d7 == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 0x10);
    auVar20[2] = -(uStack_d6 == uVar18);
    bVar19 = (byte)((uint)uVar2 >> 0x18);
    auVar20[3] = -(bStack_d5 == bVar19);
    auVar20[4] = -(uStack_d4 == uVar16);
    auVar20[5] = -(uStack_d3 == uVar17);
    auVar20[6] = -(uStack_d2 == uVar18);
    auVar20[7] = -(bStack_d1 == bVar19);
    auVar20[8] = -(uStack_d0 == uVar16);
    auVar20[9] = -(uStack_cf == uVar17);
    auVar20[10] = -(uStack_ce == uVar18);
    auVar20[0xb] = -(bStack_cd == bVar19);
    auVar20[0xc] = -(uStack_cc == uVar16);
    auVar20[0xd] = -(uStack_cb == uVar17);
    auVar20[0xe] = -(uStack_ca == uVar18);
    auVar20[0xf] = -(bStack_c9 == bVar19);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); local_100 = scope,
        local_e8 = this, uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
      uVar5 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (local_118 == ppVar10[uVar15 * 0xf + (ulong)uVar5].first) {
        ppVar10 = ppVar10 + uVar15 * 0xf + (ulong)uVar5;
        goto LAB_002a21dc;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_c9) == 0) break;
    lVar14 = uVar15 + uVar12;
    uVar12 = uVar12 + 1;
    uVar15 = lVar14 + 1U & uVar3;
  } while (uVar12 <= uVar3);
  if ((this->netAliases).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
      .size_ctrl.size <
      (this->netAliases).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              ((locator *)&local_c0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
                *)&this->netAliases,pos0,hash,(try_emplace_args_t *)&local_70,&local_118);
    ppVar10 = (value_type_pointer)
              local_c0.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*const&>
              ((locator *)&local_c0,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>>>>
                *)&this->netAliases,hash,(try_emplace_args_t *)&local_70,&local_118);
    ppVar10 = (value_type_pointer)
              local_c0.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
LAB_002a21dc:
  this_02 = &ppVar10->second;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::end(&local_70,this_02);
  local_e0 = this_02;
  IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::find
            (&local_c0,this_02,&local_f8);
  this_00 = &local_c0.super_iterator.super_const_iterator.path;
  this_01 = &local_70.super_const_iterator.path;
  do {
    SVar11 = (SourceLocation)this_01;
    bVar8 = IntervalMapDetails::Path::operator==(this_00,this_01);
    if (bVar8) {
LAB_002a230d:
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,
                 (EVP_PKEY_CTX *)SVar11);
      pCVar7 = local_e8;
      local_c0.super_iterator.super_const_iterator.map =
           (IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U> *)
           BumpAllocator::
           emplace<slang::ast::Compilation::NetAlias,slang::ast::Symbol_const*&,std::pair<unsigned_long,unsigned_long>&,slang::ast::Expression_const*&,slang::ast::Expression_const*&>
                     (&local_e8->super_BumpAllocator,&local_108,&secondRange,&local_110,&local_120);
      SVar11 = (SourceLocation)&local_f8;
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::insert
                (local_e0,(pair<unsigned_long,_unsigned_long> *)SVar11,(NetAlias **)&local_c0,
                 &pCVar7->netAliasAllocator);
      if (((bVar8) && (local_118 == local_108)) &&
         ((local_f8.first <= secondRange.second && (secondRange.first <= local_f8.second)))) {
        pDVar9 = Scope::addDiag(local_100,(DiagCode)0x1b000d,local_110->sourceRange);
        SVar11 = (local_120->sourceRange).startLoc;
        Diagnostic::operator<<(pDVar9,local_120->sourceRange);
      }
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_01,
                 (EVP_PKEY_CTX *)SVar11);
      return;
    }
    plVar4 = *(long **)((long)local_c0.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [(long)((long)&(((value_type_pointer)
                                              (local_c0.super_iterator.super_const_iterator.path.
                                               path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .len + -0xd0))->second).rootSize + 3)].node +
                       (ulong)local_c0.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [(long)((long)&(((value_type_pointer)
                                              (local_c0.super_iterator.super_const_iterator.path.
                                               path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .len + -0xd0))->second).rootSize + 3)].offset * 8 +
                       0x80);
    if ((((Symbol *)*plVar4 == local_108) && ((ulong)plVar4[1] <= secondRange.second)) &&
       (secondRange.first <= (ulong)plVar4[2])) {
      if ((Symbol *)*plVar4 == local_118) {
        pDVar9 = Scope::addDiag(local_100,(DiagCode)0x1b000d,local_110->sourceRange);
        SVar11 = (local_120->sourceRange).startLoc;
        Diagnostic::operator<<(pDVar9,local_120->sourceRange);
      }
      else {
        pDVar9 = Scope::addDiag(local_100,(DiagCode)0x18000d,local_110->sourceRange);
        Diagnostic::addNote(pDVar9,(DiagCode)0x27000d,local_120->sourceRange);
        Diagnostic::addNote(pDVar9,(DiagCode)0x26000d,*(SourceRange *)(plVar4[3] + 0x20));
        SVar11 = (SourceLocation)&DAT_0027000d;
        Diagnostic::addNote(pDVar9,(DiagCode)0x27000d,*(SourceRange *)(plVar4[4] + 0x20));
      }
      goto LAB_002a230d;
    }
    IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
    operator++(&local_c0);
  } while( true );
}

Assistant:

void Compilation::noteNetAlias(const Scope& scope, const Symbol& firstSym,
                               DriverBitRange firstRange, const Expression& firstExpr,
                               const Symbol& secondSym, DriverBitRange secondRange,
                               const Expression& secondExpr) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(firstRange.second - firstRange.first == secondRange.second - secondRange.first);

    auto overlaps = [](DriverBitRange a, DriverBitRange b) {
        return a.first <= b.second && b.first <= a.second;
    };

    const Symbol* a = &firstSym;
    const Symbol* b = &secondSym;
    const Expression* firstExprPtr = &firstExpr;
    const Expression* secondExprPtr = &secondExpr;
    if (a > b) {
        std::swap(a, b);
        std::swap(firstRange, secondRange);
        std::swap(firstExprPtr, secondExprPtr);
    }

    bool errored = false;
    auto& imap = netAliases[a];
    const auto end = imap.end();
    for (auto it = imap.find(firstRange); it != end; ++it) {
        auto curr = *it;
        if (curr->sym == b && overlaps(curr->range, secondRange)) {
            errored = true;
            if (curr->sym == a) {
                scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange)
                    << secondExprPtr->sourceRange;
            }
            else {
                auto& diag = scope.addDiag(diag::MultipleNetAlias, firstExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, secondExprPtr->sourceRange);
                diag.addNote(diag::NoteAliasDeclaration, curr->firstExpr->sourceRange);
                diag.addNote(diag::NoteAliasedTo, curr->secondExpr->sourceRange);
            }
            break;
        }
    }

    auto newAlias = emplace<NetAlias>(b, secondRange, firstExprPtr, secondExprPtr);
    imap.insert(firstRange, newAlias, netAliasAllocator);

    if (!errored && a == b && overlaps(firstRange, secondRange)) {
        scope.addDiag(diag::NetAliasSelf, firstExprPtr->sourceRange) << secondExprPtr->sourceRange;
    }
}